

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O3

void Abc_NtkPrintBoxInfo(Abc_Ntk_t *pNtk)

{
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Abc_Ntk_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong local_40;
  
  if ((pNtk->pDesign == (Abc_Des_t *)0x0) ||
     (pVVar2 = pNtk->pDesign->vModules, pVVar2 == (Vec_Ptr_t *)0x0)) {
    return;
  }
  uVar8 = pVVar2->nSize;
  if (1 < (long)(int)uVar8) {
    qsort(pVVar2->pArray,(long)(int)uVar8,8,Abc_NtkCompareNames);
    uVar8 = pVVar2->nSize;
  }
  if (0 < (int)uVar8) {
    uVar15 = (ulong)uVar8;
    ppvVar3 = pVVar2->pArray;
    uVar10 = 0;
    do {
      if ((Abc_Ntk_t *)ppvVar3[uVar10] == pNtk) {
        if ((int)uVar10 < (int)uVar8) {
          pvVar9 = *ppvVar3;
          *ppvVar3 = ppvVar3[uVar10];
          pVVar2->pArray[uVar10] = pvVar9;
          local_40 = 0x10;
          if (0x10 < uVar8) {
            local_40 = (ulong)uVar8;
          }
          pvVar9 = malloc(local_40 * 4);
          uVar7 = uVar8;
          if (pvVar9 != (void *)0x0) {
            memset(pvVar9,0,uVar15 * 4);
            uVar7 = pVVar2->nSize;
          }
          uVar10 = (ulong)uVar7;
          if (0 < (int)uVar7) {
            lVar12 = 0;
            do {
              pAVar4 = (Abc_Ntk_t *)pVVar2->pArray[lVar12];
              if (pAVar4->vBoxes->nSize != 0) {
                if ((int)local_40 < (int)uVar8) {
                  if (pvVar9 == (void *)0x0) {
                    pvVar9 = malloc(uVar15 << 2);
                  }
                  else {
                    pvVar9 = realloc(pvVar9,uVar15 << 2);
                  }
                  local_40 = (ulong)uVar8;
                  if (pvVar9 == (void *)0x0) {
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                  ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                }
                memset(pvVar9,0,uVar15 * 4);
                pVVar5 = pAVar4->vBoxes;
                iVar13 = pVVar5->nSize;
                if (0 < iVar13) {
                  ppvVar3 = pVVar5->pArray;
                  lVar11 = 0;
                  do {
                    pvVar6 = *(void **)((long)ppvVar3[lVar11] + 0x38);
                    if (pvVar6 != (void *)0x0) {
                      iVar13 = pVVar2->nSize;
                      if ((long)iVar13 < 1) {
LAB_008532b5:
                        __assert_fail("Num >= 0 && Num < Vec_PtrSize(vMods)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                                      ,0x1d5,"void Abc_NtkPrintBoxInfo(Abc_Ntk_t *)");
                      }
                      lVar14 = 0;
                      while (pVVar2->pArray[lVar14] != pvVar6) {
                        lVar14 = lVar14 + 1;
                        if (iVar13 == lVar14) goto LAB_008532b5;
                      }
                      if (iVar13 <= (int)lVar14) goto LAB_008532b5;
                      if ((int)uVar8 <= (int)lVar14) {
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
                      }
                      piVar1 = (int *)((long)pvVar9 + lVar14 * 4);
                      *piVar1 = *piVar1 + 1;
                      iVar13 = pVVar5->nSize;
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < iVar13);
                }
                printf("MODULE  ");
                printf("%-30s : ",pAVar4->pName);
                printf("PI=%6d ",(ulong)(uint)pAVar4->vPis->nSize);
                printf("PO=%6d ",(ulong)(uint)pAVar4->vPos->nSize);
                printf("BB=%6d ",(ulong)(uint)pAVar4->vBoxes->nSize);
                printf("ND=%6d ",(ulong)(uint)pAVar4->nObjCounts[7]);
                uVar7 = Abc_NtkLevel(pAVar4);
                printf("Lev=%5d ",(ulong)uVar7);
                putchar(10);
                uVar10 = 0;
                do {
                  uVar7 = *(uint *)((long)pvVar9 + uVar10 * 4);
                  if (uVar7 != 0) {
                    if ((long)pVVar2->nSize <= (long)uVar10) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                    }
                    printf("%15d : %s\n",(ulong)uVar7,
                           *(undefined8 *)((long)pVVar2->pArray[uVar10] + 8));
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar15 != uVar10);
              }
              lVar12 = lVar12 + 1;
              uVar10 = (ulong)pVVar2->nSize;
            } while (lVar12 < (long)uVar10);
          }
          if (pvVar9 != (void *)0x0) {
            free(pvVar9);
            uVar10 = (ulong)(uint)pVVar2->nSize;
          }
          if ((int)uVar10 < 1) {
            return;
          }
          lVar12 = 0;
          do {
            pAVar4 = (Abc_Ntk_t *)pVVar2->pArray[lVar12];
            if (pAVar4->vBoxes->nSize == 0) {
              printf("MODULE   ");
              printf("%-30s : ",pAVar4->pName);
              printf("PI=%6d ",(ulong)(uint)pAVar4->vPis->nSize);
              printf("PO=%6d ",(ulong)(uint)pAVar4->vPos->nSize);
              printf("BB=%6d ",(ulong)(uint)pAVar4->vBoxes->nSize);
              printf("ND=%6d ",(ulong)(uint)pAVar4->nObjCounts[7]);
              uVar8 = Abc_NtkLevel(pAVar4);
              printf("Lev=%5d ",(ulong)uVar8);
              putchar(10);
              uVar10 = (ulong)(uint)pVVar2->nSize;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < (int)uVar10);
          return;
        }
        break;
      }
      uVar10 = uVar10 + 1;
    } while (uVar15 != uVar10);
  }
  __assert_fail("Num >= 0 && Num < Vec_PtrSize(vMods)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                ,0x1c3,"void Abc_NtkPrintBoxInfo(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkPrintBoxInfo( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel, * pBoxModel;
    Abc_Obj_t * pObj;
    Vec_Int_t * vCounts;
    int i, k, Num;
    if ( pNtk->pDesign == NULL || pNtk->pDesign->vModules == NULL )
    {
//        printf( "There is no hierarchy information.\n" );
        return;
    }
    // sort models by name
    vMods = pNtk->pDesign->vModules;
    Vec_PtrSort( vMods, (int(*)())Abc_NtkCompareNames );
//    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
//        printf( "%s\n", Abc_NtkName(pModel) );

    // swap the first model
    Num = Vec_PtrFind( vMods, pNtk );
    assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
    pBoxModel = (Abc_Ntk_t *)Vec_PtrEntry(vMods, 0);
    Vec_PtrWriteEntry(vMods, 0, (Abc_Ntk_t *)Vec_PtrEntry(vMods, Num) );
    Vec_PtrWriteEntry(vMods, Num, pBoxModel );

    // print models
    vCounts = Vec_IntStart( Vec_PtrSize(vMods) );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
    {
        if ( Abc_NtkBoxNum(pModel) == 0 )
            continue;
        Vec_IntFill( vCounts, Vec_IntSize(vCounts), 0 );
        Abc_NtkForEachBox( pModel, pObj, k )
        {
            pBoxModel = (Abc_Ntk_t *)pObj->pData;
            if ( pBoxModel == NULL )
                continue;
            Num = Vec_PtrFind( vMods, pBoxModel );
            assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
            Vec_IntAddToEntry( vCounts, Num, 1 );
        }

//        Abc_NtkPrintStats( pModel, 0, 0, 0, 0, 0, 0, 0, 0, 0 );
        printf( "MODULE  " );
        printf( "%-30s : ", Abc_NtkName(pModel) );
        printf( "PI=%6d ", Abc_NtkPiNum(pModel) );
        printf( "PO=%6d ", Abc_NtkPoNum(pModel) );
        printf( "BB=%6d ", Abc_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Abc_NtkNodeNum(pModel) ); // sans constants
        printf( "Lev=%5d ", Abc_NtkLevel(pModel) );
        printf( "\n" );

        Vec_IntForEachEntry( vCounts, Num, k )
            if ( Num )
                printf( "%15d : %s\n", Num, Abc_NtkName((Abc_Ntk_t *)Vec_PtrEntry(vMods, k)) );
    }
    Vec_IntFree( vCounts );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
    {
        if ( Abc_NtkBoxNum(pModel) != 0 )
            continue;
        printf( "MODULE   " );
        printf( "%-30s : ", Abc_NtkName(pModel) );
        printf( "PI=%6d ", Abc_NtkPiNum(pModel) );
        printf( "PO=%6d ", Abc_NtkPoNum(pModel) );
        printf( "BB=%6d ", Abc_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Abc_NtkNodeNum(pModel) );
        printf( "Lev=%5d ", Abc_NtkLevel(pModel) );
        printf( "\n" );
    }
}